

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseComment(htmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  xmlChar *pxVar3;
  bool bVar4;
  uint local_54;
  xmlChar *tmp;
  int local_40;
  xmlParserInputState state;
  int nl;
  int next;
  int l;
  int cur;
  int rl;
  int r;
  int ql;
  int q;
  int size;
  int len;
  xmlChar *buf;
  htmlParserCtxtPtr ctxt_local;
  
  _size = (xmlChar *)0x0;
  ql = 100;
  if (ctxt->token == 0) {
    local_54 = (uint)*ctxt->input->cur;
  }
  else {
    local_54 = 0xffffffff;
  }
  if (local_54 != 0x3c) {
    return;
  }
  if (ctxt->input->cur[1] != '!') {
    return;
  }
  if (ctxt->input->cur[2] != '-') {
    return;
  }
  if (ctxt->input->cur[3] != '-') {
    return;
  }
  xVar1 = ctxt->instate;
  ctxt->instate = XML_PARSER_COMMENT;
  buf = (xmlChar *)ctxt;
  if ((500 < (long)ctxt->input->cur - (long)ctxt->input->base) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlParserInputShrink(ctxt->input);
  }
  *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 4;
  *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 4;
  _size = (xmlChar *)(*xmlMallocAtomic)((long)ql);
  if (_size == (xmlChar *)0x0) {
    htmlErrMemory((xmlParserCtxtPtr)buf,"buffer allocation failed\n");
    *(xmlParserInputState *)(buf + 0x110) = xVar1;
    return;
  }
  q = 0;
  *_size = '\0';
  r = htmlCurrentChar((xmlParserCtxtPtr)buf,&rl);
  if (r != 0) {
    if (r == 0x3e) {
      htmlParseErr((xmlParserCtxtPtr)buf,XML_ERR_COMMENT_ABRUPTLY_ENDED,"Comment abruptly ended",
                   (xmlChar *)0x0,(xmlChar *)0x0);
      next = 0x3e;
    }
    else {
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
        *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
        *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
      }
      else {
        *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
      }
      buf[0x114] = '\0';
      buf[0x115] = '\0';
      buf[0x116] = '\0';
      buf[0x117] = '\0';
      *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)rl;
      cur = htmlCurrentChar((xmlParserCtxtPtr)buf,&l);
      if (cur == 0) goto LAB_0015bcbd;
      if ((r == 0x2d) && (cur == 0x3e)) {
        htmlParseErr((xmlParserCtxtPtr)buf,XML_ERR_COMMENT_ABRUPTLY_ENDED,"Comment abruptly ended",
                     (xmlChar *)0x0,(xmlChar *)0x0);
        next = 0x3e;
      }
      else {
        if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
          *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
          *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
        }
        else {
          *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
        }
        buf[0x114] = '\0';
        buf[0x115] = '\0';
        buf[0x116] = '\0';
        buf[0x117] = '\0';
        *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)l;
        next = htmlCurrentChar((xmlParserCtxtPtr)buf,&nl);
        while( true ) {
          bVar4 = false;
          if (((next != 0) && (bVar4 = true, next == 0x3e)) && (bVar4 = true, cur == 0x2d)) {
            bVar4 = r != 0x2d;
          }
          if (!bVar4) goto LAB_0015bc3d;
          if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
          }
          buf[0x114] = '\0';
          buf[0x115] = '\0';
          buf[0x116] = '\0';
          buf[0x117] = '\0';
          *(long *)(*(long *)(buf + 0x38) + 0x20) =
               *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)nl;
          state = htmlCurrentChar((xmlParserCtxtPtr)buf,&local_40);
          if (state == XML_PARSER_START) {
            if ((500 < *(long *)(*(long *)(buf + 0x38) + 0x20) -
                       *(long *)(*(long *)(buf + 0x38) + 0x18)) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                500)) {
              xmlParserInputShrink(*(xmlParserInputPtr *)(buf + 0x38));
            }
            if ((*(int *)(buf + 0x1c4) == 0) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                0xfa)) {
              xmlParserInputGrow(*(xmlParserInputPtr *)(buf + 0x38),0xfa);
            }
            state = htmlCurrentChar((xmlParserCtxtPtr)buf,&local_40);
          }
          if ((((r == 0x2d) && (cur == 0x2d)) && (next == 0x21)) && (state == 0x3e)) break;
          pxVar3 = _size;
          if (ql <= q + 5) {
            ql = ql << 1;
            pxVar3 = (xmlChar *)(*xmlRealloc)(_size,(long)ql);
            if (pxVar3 == (xmlChar *)0x0) {
              (*xmlFree)(_size);
              htmlErrMemory((xmlParserCtxtPtr)buf,"growing buffer failed\n");
              *(xmlParserInputState *)(buf + 0x110) = xVar1;
              return;
            }
          }
          _size = pxVar3;
          if (r < 0x100) {
            if (((r < 9) || (10 < r)) && ((r != 0xd && (r < 0x20)))) goto LAB_0015bbfa;
LAB_0015bbba:
            if (rl == 1) {
              _size[q] = (xmlChar)r;
              q = q + 1;
            }
            else {
              iVar2 = xmlCopyChar(rl,_size + q,r);
              q = iVar2 + q;
            }
          }
          else {
            if ((((0xff < r) && (r < 0xd800)) || ((0xdfff < r && (r < 0xfffe)))) ||
               ((0xffff < r && (r < 0x110000)))) goto LAB_0015bbba;
LAB_0015bbfa:
            htmlParseErrInt((xmlParserCtxtPtr)buf,XML_ERR_INVALID_CHAR,
                            "Invalid char in comment 0x%X\n",r);
          }
          r = cur;
          rl = l;
          cur = next;
          l = nl;
          next = state;
          nl = local_40;
        }
        htmlParseErr((xmlParserCtxtPtr)buf,XML_ERR_COMMENT_NOT_FINISHED,
                     "Comment incorrectly closed by \'--!>\'",(xmlChar *)0x0,(xmlChar *)0x0);
        next = 0x3e;
      }
    }
LAB_0015bc3d:
    _size[q] = '\0';
    if (next == 0x3e) {
      xmlNextChar((xmlParserCtxtPtr)buf);
      if (((*(long *)buf != 0) && (*(long *)(*(long *)buf + 0xa0) != 0)) &&
         (*(int *)(buf + 0x14c) == 0)) {
        (**(code **)(*(long *)buf + 0xa0))(*(undefined8 *)(buf + 8),_size);
      }
      (*xmlFree)(_size);
      *(xmlParserInputState *)(buf + 0x110) = xVar1;
      return;
    }
  }
LAB_0015bcbd:
  htmlParseErr((xmlParserCtxtPtr)buf,XML_ERR_COMMENT_NOT_FINISHED,
               "Comment not terminated \n<!--%.50s\n",_size,(xmlChar *)0x0);
  (*xmlFree)(_size);
  return;
}

Assistant:

static void
htmlParseComment(htmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len;
    int size = HTML_PARSER_BUFFER_SIZE;
    int q, ql;
    int r, rl;
    int cur, l;
    int next, nl;
    xmlParserInputState state;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;

    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    SHRINK;
    SKIP(4);
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        htmlErrMemory(ctxt, "buffer allocation failed\n");
	ctxt->instate = state;
	return;
    }
    len = 0;
    buf[len] = 0;
    q = CUR_CHAR(ql);
    if (q == 0)
        goto unfinished;
    if (q == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto unfinished;
    if (q == '-' && r == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    while ((cur != 0) &&
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	NEXTL(l);
	next = CUR_CHAR(nl);
	if (next == 0) {
	    SHRINK;
	    GROW;
	    next = CUR_CHAR(nl);
	}

	if ((q == '-') && (r == '-') && (cur == '!') && (next == '>')) {
	  htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		       "Comment incorrectly closed by '--!>'", NULL, NULL);
	  cur = '>';
	  break;
	}

	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
	        htmlErrMemory(ctxt, "growing buffer failed\n");
		ctxt->instate = state;
		return;
	    }
	    buf = tmp;
	}
        if (IS_CHAR(q)) {
	    COPY_BUF(ql,buf,len,q);
        } else {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in comment 0x%X\n", q);
        }

	q = r;
	ql = rl;
	r = cur;
	rl = l;
	cur = next;
	l = nl;
    }
finished:
    buf[len] = 0;
    if (cur == '>') {
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
	xmlFree(buf);
	ctxt->instate = state;
	return;
    }

unfinished:
    htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		 "Comment not terminated \n<!--%.50s\n", buf, NULL);
    xmlFree(buf);
}